

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

Optional<Catch::ColourMode> * __thiscall
Catch::Optional<Catch::ColourMode>::operator=
          (Optional<Catch::ColourMode> *this,Optional<Catch::ColourMode> *_other)

{
  bool bVar1;
  ColourMode *pCVar2;
  Optional<Catch::ColourMode> *_other_local;
  Optional<Catch::ColourMode> *this_local;
  
  if (_other != this) {
    reset(this);
    bVar1 = Catch::Optional::operator_cast_to_bool((Optional *)_other);
    if (bVar1) {
      pCVar2 = operator*(_other);
      this->storage[0] = *pCVar2;
      this->nullableValue = (ColourMode *)this->storage;
    }
  }
  return this;
}

Assistant:

Optional& operator=( Optional&& _other ) {
            if ( &_other != this ) {
                reset();
                if ( _other ) {
                    nullableValue = new ( storage ) T( CATCH_MOVE( *_other ) );
                }
            }
            return *this;
        }